

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void fftCosInit(long M,float *Utbl)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  *Utbl = 1.0;
  uVar1 = (ulong)(1L << (M & 0x3fU)) >> 2;
  for (uVar2 = 1; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    dVar3 = cos((double)(long)uVar2 * 6.283185307179586 * (double)(0x3ff0000000000000 - (M << 0x34))
               );
    Utbl[uVar2] = (float)dVar3;
  }
  Utbl[uVar1] = 0.0;
  return;
}

Assistant:

void fftCosInit(long M, float *Utbl){
/* Compute Utbl, the cosine table for ffts	*/
/* of size (pow(2,M)/4 +1)	*/
/* INPUTS */
/* M = log2 of fft size	*/
/* OUTPUTS */
/* *Utbl = cosine table	*/
unsigned long fftN = POW2(M);
unsigned long i1;
	Utbl[0] = 1.0;
	for (i1 = 1; i1 < fftN/4; i1++)
		Utbl[i1] = cos( (2.0 * MYPI * i1) / fftN );
	Utbl[fftN/4] = 0.0;
}